

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expLabelFuncOrga(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters
                )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer psVar2;
  element_type *args_1;
  anon_union_8_2_b358304e_for_ExpressionValue_1 aVar3;
  
  psVar2 = (parameters->
           super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((parameters->
      super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>)._M_impl.
      super__Vector_impl_data._M_finish == psVar2) {
    paVar1 = &(__return_storage_ptr__->strValue)._value.field_2;
    if ((g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      aVar3.intValue = FileManager::getPhysicalAddress(g_fileManager);
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p = (pointer)paVar1;
LAB_0012e9e9:
      (__return_storage_ptr__->strValue)._value._M_string_length = 0;
      (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->type = Integer;
      goto LAB_0012ea43;
    }
    Logger::queueError<Identifier>
              ((Logger *)0x1,0x18861d,(char *)funcName,(Identifier *)&g_fileManager);
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    args_1 = (psVar2->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (args_1 != (element_type *)0x0) {
      if (args_1->physicalValueSet != false) {
        aVar3 = (anon_union_8_2_b358304e_for_ExpressionValue_1)args_1->physicalValue;
        (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
        goto LAB_0012e9e9;
      }
      Logger::queueError<Identifier,Identifier>
                (Error,"%s: parameter %s has no physical address",funcName,&args_1->name);
    }
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  }
  aVar3.intValue = 0;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
LAB_0012ea43:
  __return_storage_ptr__->field_1 = aVar3;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expLabelFuncOrga(const Identifier &funcName, const std::vector<std::shared_ptr<Label>>& parameters)
{
	// return physical address of label parameter
	if (parameters.size())
	{
		Label* label = parameters.front().get();
		if (!label)
			return ExpressionValue();

		if (!label->hasPhysicalValue())
		{
			Logger::queueError(Logger::Error, "%s: parameter %s has no physical address", funcName, label->getName());
			return ExpressionValue();
		}

		return ExpressionValue(parameters.front()->getPhysicalValue());
	}

	// return current physical address otherwise
	if(!g_fileManager->hasOpenFile())
	{
		Logger::queueError(Logger::Error, "%s: no file opened", funcName);
		return ExpressionValue();
	}
	return ExpressionValue(g_fileManager->getPhysicalAddress());
}